

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O1

void deqp::gles3::Functional::DepthStencilCaseUtil::renderReference
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,PixelBufferAccess *dstColor,PixelBufferAccess *dstStencil,int stencilBits)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  pointer pCVar4;
  PixelBufferAccess local_58;
  
  pCVar4 = (clears->
           super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(clears->
                              super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) >> 3) *
          -0x33333333) {
    lVar3 = 0x14;
    lVar2 = 0;
    do {
      if ((*(byte *)((long)(pCVar4->color).m_data + lVar3 + -0x17) & 0x40) != 0) {
        tcu::getSubregion(&local_58,dstColor,*(int *)((long)(pCVar4->color).m_data + lVar3 + -0x28),
                          *(int *)((long)(pCVar4->color).m_data + lVar3 + -0x24),
                          *(int *)((long)(&pCVar4->color + -2) + lVar3),
                          *(int *)((long)(pCVar4->color).m_data + lVar3 + -0x1c));
        tcu::clear(&local_58,(Vec4 *)((long)(pCVar4->color).m_data + lVar3 + -0x14));
      }
      if ((0 < stencilBits) &&
         ((*(uint *)((long)(pCVar4->color).m_data + lVar3 + -0x18) & 0x400) != 0)) {
        uVar1 = *(uint *)((long)(pCVar4->color).m_data + lVar3 + -4);
        tcu::getSubregion(&local_58,dstStencil,
                          *(int *)((long)(pCVar4->color).m_data + lVar3 + -0x28),
                          *(int *)((long)(pCVar4->color).m_data + lVar3 + -0x24),
                          *(int *)((long)(&pCVar4->color + -2) + lVar3),
                          *(int *)((long)(pCVar4->color).m_data + lVar3 + -0x1c));
        tcu::clearStencil(&local_58,uVar1 & ~(-1 << ((byte)stencilBits & 0x1f)));
      }
      lVar2 = lVar2 + 1;
      pCVar4 = (clears->
               super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x28;
    } while (lVar2 < (int)((ulong)((long)(clears->
                                         super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4)
                          >> 3) * -0x33333333);
  }
  return;
}

Assistant:

void renderReference (const vector<ClearCommand>& clears, const tcu::PixelBufferAccess& dstColor, const tcu::PixelBufferAccess& dstStencil, int stencilBits)
{
	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)
			tcu::clear(tcu::getSubregion(dstColor, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), clear.color);

		if (clear.buffers & GL_STENCIL_BUFFER_BIT && stencilBits > 0)
		{
			int maskedVal = clear.stencil & ((1<<stencilBits)-1);
			tcu::clearStencil(tcu::getSubregion(dstStencil, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), maskedVal);
		}

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.
	}
}